

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void bfgs_iter_middle<dense_parameters>
               (vw *all,bfgs *b,float *mem,double *rho,double *alpha,int *lastj,int *origin,
               dense_parameters *weights)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  weight *pwVar5;
  bool bVar6;
  double dVar7;
  uint32_t uVar8;
  long lVar9;
  long lVar10;
  uint64_t uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  byte bVar14;
  int iVar15;
  weight *pwVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  anon_union_4_2_947300a4 x;
  double dVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  
  if (b->m != 0) {
    if (all->quiet == false) {
      bfgs_iter_middle<dense_parameters>();
    }
    pwVar5 = weights->_begin;
    if (pwVar5 != pwVar5 + weights->_weight_mask + 1) {
      uVar8 = weights->_stride_shift;
      iVar19 = b->mem_stride;
      iVar15 = *origin;
      dVar20 = 0.0;
      dVar21 = 0.0;
      dVar7 = 0.0;
      lVar18 = 0;
      do {
        lVar9 = ((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar19;
        mem[lVar9 + iVar15 % iVar19] =
             *(float *)((long)pwVar5 + lVar18 + 4) - mem[lVar9 + iVar15 % iVar19];
        lVar10 = (long)((*origin + 1) % b->mem_stride);
        mem[lVar9 + lVar10] = *(float *)((long)pwVar5 + lVar18) - mem[lVar9 + lVar10];
        fVar23 = *(float *)((long)pwVar5 + lVar18 + 4);
        *(float *)((long)pwVar5 + lVar18 + 8) = fVar23;
        iVar15 = *origin;
        iVar19 = b->mem_stride;
        dVar22 = (double)mem[lVar9 + iVar15 % iVar19];
        dVar7 = dVar7 + dVar22 * (double)mem[lVar9 + (iVar15 + 1) % iVar19];
        dVar20 = dVar20 + (double)mem[lVar9 + (iVar15 + 1) % iVar19] * (double)fVar23;
        dVar21 = dVar21 + dVar22 * dVar22 * (double)*(float *)((long)pwVar5 + lVar18 + 0xc);
        lVar18 = lVar18 + (1L << ((byte)uVar8 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar5 + lVar18) != weights->_begin + weights->_weight_mask + 1);
      if ((0.0 < dVar7) && (0.0 < dVar21)) {
        *rho = 1.0 / dVar7;
        lVar18 = (long)*lastj;
        if (0 < lVar18) {
          lVar9 = 0;
          do {
            alpha[lVar9] = dVar20 * rho[lVar9];
            pwVar5 = weights->_begin;
            if (pwVar5 == pwVar5 + weights->_weight_mask + 1) {
              dVar20 = 0.0;
            }
            else {
              uVar8 = weights->_stride_shift;
              iVar19 = b->mem_stride;
              iVar15 = *origin;
              dVar20 = 0.0;
              lVar18 = 0;
              do {
                lVar10 = ((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                         (long)iVar19;
                fVar23 = *(float *)((long)pwVar5 + lVar18 + 8) -
                         (float)alpha[lVar9] * mem[lVar10 + (iVar15 + (int)lVar9 * 2) % iVar19];
                *(float *)((long)pwVar5 + lVar18 + 8) = fVar23;
                iVar15 = *origin;
                iVar19 = b->mem_stride;
                dVar20 = dVar20 + (double)fVar23 *
                                  (double)mem[lVar10 + ((int)lVar9 * 2 + 3 + iVar15) % iVar19];
                lVar18 = lVar18 + (1L << ((byte)uVar8 & 0x3f)) * 4;
              } while ((weight *)((long)pwVar5 + lVar18) !=
                       weights->_begin + weights->_weight_mask + 1);
            }
            lVar9 = lVar9 + 1;
            lVar18 = (long)*lastj;
          } while (lVar9 < lVar18);
        }
        alpha[lVar18] = dVar20 * rho[lVar18];
        pwVar5 = weights->_begin;
        uVar11 = weights->_weight_mask;
        uVar17 = *lastj;
        if (pwVar5 == pwVar5 + uVar11 + 1) {
          dVar20 = 0.0;
          pwVar16 = pwVar5;
        }
        else {
          uVar8 = weights->_stride_shift;
          iVar19 = b->mem_stride;
          iVar15 = *origin;
          dVar20 = 0.0;
          lVar18 = 0;
          do {
            lVar9 = ((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar19;
            fVar23 = *(float *)((long)pwVar5 + lVar18 + 0xc) * (float)(dVar7 / dVar21) *
                     (*(float *)((long)pwVar5 + lVar18 + 8) -
                     (float)alpha[(int)uVar17] * mem[lVar9 + (int)(iVar15 + uVar17 * 2) % iVar19]);
            *(float *)((long)pwVar5 + lVar18 + 8) = fVar23;
            uVar17 = *lastj;
            iVar15 = *origin;
            iVar19 = b->mem_stride;
            dVar20 = dVar20 + (double)fVar23 *
                              (double)mem[lVar9 + (int)(iVar15 + uVar17 * 2) % iVar19];
            pwVar16 = weights->_begin;
            uVar11 = weights->_weight_mask;
            lVar18 = lVar18 + (1L << ((byte)uVar8 & 0x3f)) * 4;
          } while ((weight *)((long)pwVar5 + lVar18) != pwVar16 + uVar11 + 1);
        }
        if (0 < (int)uVar17) {
          uVar12 = (ulong)uVar17;
          do {
            if (pwVar16 == pwVar16 + uVar11 + 1) {
              dVar20 = 0.0;
              pwVar5 = pwVar16;
            }
            else {
              uVar8 = weights->_stride_shift;
              dVar21 = dVar20 * rho[uVar12];
              dVar7 = alpha[uVar12];
              iVar19 = b->mem_stride;
              iVar15 = *origin;
              dVar20 = 0.0;
              lVar18 = 0;
              do {
                lVar9 = ((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                        (long)iVar19;
                fVar23 = mem[lVar9 + (iVar15 + (int)uVar12 * 2 + 1) % iVar19] *
                         (float)(dVar7 - dVar21) + *(float *)((long)pwVar16 + lVar18 + 8);
                *(float *)((long)pwVar16 + lVar18 + 8) = fVar23;
                iVar15 = *origin;
                iVar19 = b->mem_stride;
                dVar20 = dVar20 + (double)fVar23 *
                                  (double)mem[lVar9 + ((int)uVar12 * 2 + -2 + iVar15) % iVar19];
                uVar11 = weights->_weight_mask;
                lVar18 = lVar18 + (1L << ((byte)uVar8 & 0x3f)) * 4;
                pwVar5 = weights->_begin;
              } while ((weight *)((long)pwVar16 + lVar18) != weights->_begin + uVar11 + 1);
            }
            pwVar16 = pwVar5;
            bVar6 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar6);
        }
        if (pwVar16 != pwVar16 + uVar11 + 1) {
          uVar8 = weights->_stride_shift;
          dVar7 = *rho;
          dVar21 = *alpha;
          lVar18 = 0;
          do {
            *(float *)((long)pwVar16 + lVar18 + 8) =
                 mem[((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                     (long)b->mem_stride + (long)((*origin + 1) % b->mem_stride)] *
                 -(float)(dVar21 - dVar20 * dVar7) - *(float *)((long)pwVar16 + lVar18 + 8);
            lVar18 = lVar18 + (1L << ((byte)uVar8 & 0x3f)) * 4;
          } while ((weight *)((long)pwVar16 + lVar18) != weights->_begin + weights->_weight_mask + 1
                  );
        }
        iVar15 = b->m + -1;
        iVar19 = *lastj + 1;
        if (iVar15 <= *lastj) {
          iVar19 = iVar15;
        }
        *lastj = iVar19;
        *origin = (*origin + b->mem_stride + -2) % b->mem_stride;
        pwVar5 = weights->_begin;
        if (pwVar5 != pwVar5 + weights->_weight_mask + 1) {
          uVar8 = weights->_stride_shift;
          lVar18 = 0;
          do {
            lVar9 = ((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) *
                    (long)b->mem_stride;
            mem[lVar9 + *origin % b->mem_stride] = *(float *)((long)pwVar5 + lVar18 + 4);
            mem[lVar9 + (*origin + 1) % b->mem_stride] = *(float *)((long)pwVar5 + lVar18);
            *(undefined4 *)((long)pwVar5 + lVar18 + 4) = 0;
            lVar18 = lVar18 + (1L << ((byte)uVar8 & 0x3f)) * 4;
          } while ((weight *)((long)pwVar5 + lVar18) != weights->_begin + weights->_weight_mask + 1)
          ;
        }
        if ((long)*lastj < 1) {
          return;
        }
        uVar12 = (long)*lastj + 1;
        do {
          rho[uVar12 - 1] = rho[uVar12 - 2];
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
        return;
      }
    }
    puVar13 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar13 = &PTR__exception_002cf458;
    __cxa_throw(puVar13,&curv_exception::typeinfo,std::exception::~exception);
  }
  bVar14 = (byte)weights->_stride_shift;
  uVar12 = 1L << (bVar14 & 0x3f);
  pwVar5 = weights->_begin;
  if (pwVar5 == pwVar5 + weights->_weight_mask + 1) {
    fVar23 = NAN;
LAB_001bbffd:
    if ((~(uint)fVar23 & 0x7fc00000) != 0) goto LAB_001bc00d;
  }
  else {
    fVar23 = 0.0;
    fVar4 = 0.0;
    lVar18 = 0;
    do {
      fVar1 = *(float *)((long)pwVar5 + lVar18 + 4);
      fVar2 = mem[(long)(*origin % b->mem_stride) +
                  ((ulong)(lVar18 >> 2) >> (bVar14 & 0x3f)) * (long)b->mem_stride];
      fVar3 = *(float *)((long)pwVar5 + lVar18 + 0xc);
      fVar23 = fVar23 + (fVar1 - fVar2) * fVar3 * fVar1;
      fVar4 = fVar4 + fVar2 * fVar3 * fVar2;
      lVar18 = lVar18 + uVar12 * 4;
    } while (weights->_weight_mask * 4 + 4 != lVar18);
    fVar23 = fVar23 / fVar4;
    if (0.0 <= fVar23) goto LAB_001bbffd;
  }
  fVar23 = 0.0;
LAB_001bc00d:
  if (pwVar5 != pwVar5 + weights->_weight_mask + 1) {
    lVar18 = 0;
    do {
      fVar4 = *(float *)((long)pwVar5 + lVar18 + 4);
      mem[((ulong)(lVar18 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * (long)b->mem_stride +
          (long)(*origin % b->mem_stride)] = fVar4;
      *(float *)((long)pwVar5 + lVar18 + 8) =
           *(float *)((long)pwVar5 + lVar18 + 8) * fVar23 -
           fVar4 * *(float *)((long)pwVar5 + lVar18 + 0xc);
      *(undefined4 *)((long)pwVar5 + lVar18 + 4) = 0;
      lVar18 = lVar18 + (uVar12 & 0xffffffff) * 4;
    } while ((weight *)((long)pwVar5 + lVar18) != weights->_begin + weights->_weight_mask + 1);
  }
  if (all->quiet == false) {
    bfgs_iter_middle<dense_parameters>();
  }
  return;
}

Assistant:

void bfgs_iter_middle(vw& all, bfgs& b, float* mem, double* rho, double* alpha, int& lastj, int& origin, T& weights)
{
  float* mem0 = mem;
  uint32_t length = 1 << all.num_bits;
  // implement conjugate gradient
  if (b.m == 0)
  {
    double g_Hy = 0.;
    double g_Hg = 0.;
    double y = 0.;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      y = (&(*w))[W_GT] - mem[(MEM_GT + origin) % b.mem_stride];
      g_Hy += ((double)(&(*w))[W_GT]) * ((&(*w))[W_COND]) * y;
      g_Hg +=
          ((double)mem[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_COND]) * mem[(MEM_GT + origin) % b.mem_stride];
    }

    float beta = (float)(g_Hy / g_Hg);

    if (beta < 0.f || nanpattern(beta))
      beta = 0.f;

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];

      (&(*w))[W_DIR] *= beta;
      (&(*w))[W_DIR] -= ((&(*w))[W_COND]) * ((&(*w))[W_GT]);
      (&(*w))[W_GT] = 0;
    }
    if (!all.quiet)
      fprintf(stderr, "%f\t", beta);
    return;

    mem = mem0 + (length - 1) * b.mem_stride;
  }
  else
  {
    if (!all.quiet)
      fprintf(stderr, "%-10s\t", "");
  }

  // implement bfgs
  double y_s = 0.;
  double y_Hy = 0.;
  double s_q = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem1[(MEM_YT + origin) % b.mem_stride] = (&(*w))[W_GT] - mem1[(MEM_GT + origin) % b.mem_stride];
    mem1[(MEM_ST + origin) % b.mem_stride] = (&(*w))[W_XT] - mem1[(MEM_XT + origin) % b.mem_stride];
    (&(*w))[W_DIR] = (&(*w))[W_GT];
    y_s += ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_ST + origin) % b.mem_stride];
    y_Hy +=
        ((double)mem1[(MEM_YT + origin) % b.mem_stride]) * mem1[(MEM_YT + origin) % b.mem_stride] * ((&(*w))[W_COND]);
    s_q += ((double)mem1[(MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_GT]);
  }

  if (y_s <= 0. || y_Hy <= 0.)
    throw curv_ex;
  rho[0] = 1 / y_s;

  float gamma = (float)(y_s / y_Hy);

  for (int j = 0; j < lastj; j++)
  {
    alpha[j] = rho[j] * s_q;
    s_q = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] -= (float)alpha[j] * mem[(2 * j + MEM_YT + origin) % b.mem_stride];
      s_q += ((double)mem[(2 * j + 2 + MEM_ST + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  alpha[lastj] = rho[lastj] * s_q;
  double y_r = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] -= (float)alpha[lastj] * mem[(2 * lastj + MEM_YT + origin) % b.mem_stride];
    (&(*w))[W_DIR] *= gamma * ((&(*w))[W_COND]);
    y_r += ((double)mem[(2 * lastj + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
  }

  double coef_j;

  for (int j = lastj; j > 0; j--)
  {
    coef_j = alpha[j] - rho[j] * y_r;
    y_r = 0.;
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
      (&(*w))[W_DIR] += (float)coef_j * mem[(2 * j + MEM_ST + origin) % b.mem_stride];
      y_r += ((double)mem[(2 * j - 2 + MEM_YT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    }
  }

  coef_j = alpha[0] - rho[0] * y_r;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    (&(*w))[W_DIR] = -(&(*w))[W_DIR] - (float)coef_j * mem[(MEM_ST + origin) % b.mem_stride];
  }

  /*********************
  ** shift
  ********************/

  lastj = (lastj < b.m - 1) ? lastj + 1 : b.m - 1;
  origin = (origin + b.mem_stride - 2) % b.mem_stride;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    mem = mem0 + (w.index() >> weights.stride_shift()) * b.mem_stride;
    mem[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    mem[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    (&(*w))[W_GT] = 0;
  }
  for (int j = lastj; j > 0; j--) rho[j] = rho[j - 1];
}